

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

bool __thiscall
rapidjson::
GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
::Uint64(GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
         *this,uint64_t i)

{
  size_t in_RSI;
  Stack<rapidjson::CrtAllocator> *in_RDI;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_> *ret
  ;
  char **u64;
  char **this_00;
  
  u64 = &in_RDI->stackEnd_;
  this_00 = u64;
  if ((long)in_RDI[1].stack_ - (long)in_RDI[1].ownAllocator_ < 0x10) {
    internal::Stack<rapidjson::CrtAllocator>::
    Expand<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              (in_RDI,in_RSI);
  }
  u64[3] = (char *)((long)u64[3] + 0x10);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)this_00,(uint64_t)u64);
  return true;
}

Assistant:

bool Uint64(uint64_t i) { new (stack_.template Push<ValueType>()) ValueType(i); return true; }